

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void bit_move_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  undefined8 unaff_RBP;
  ulong uVar4;
  MCInst *MI_00;
  
  lVar3 = (ulong)*address - (ulong)info->offset;
  if ((uint)lVar3 < info->size) {
    uVar4 = CONCAT71((int7)((ulong)unaff_RBP >> 8),info->code[lVar3]);
  }
  else {
    uVar4 = 0;
  }
  *address = *address + 1;
  add_reg_operand(info,bit_move_hdlr::m680x_reg[(byte)((uVar4 & 0xffffffff) >> 6) & 3]);
  bVar1 = (info->m680x).op_count;
  (info->m680x).operands[bVar1].type = M680X_OP_CONSTANT;
  MI_00 = (MCInst *)
          (CONCAT71((int7)((uVar4 & 0xffffffff) >> 8),(byte)(uVar4 & 0xffffffff) >> 3) &
          0xffffffffffffff07);
  (info->m680x).operands[bVar1].field_1.direct_addr = (uint8_t)MI_00;
  (info->m680x).op_count = bVar1 + 2;
  uVar2 = bVar1 + 1 & 0xff;
  (info->m680x).operands[uVar2].type = M680X_OP_CONSTANT;
  (info->m680x).operands[uVar2].field_1.direct_addr = (byte)uVar4 & 7;
  direct_hdlr(MI_00,info,address);
  return;
}

Assistant:

static void bit_move_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const m680x_reg m680x_reg[] = {
		M680X_REG_CC, M680X_REG_A, M680X_REG_B, M680X_REG_INVALID,
	};

	uint8_t post_byte = 0;
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op;

	read_byte(info, &post_byte, *address);
	(*address)++;

	// operand[0] = register
	add_reg_operand(info, m680x_reg[post_byte >> 6]);

	// operand[1] = bit index in source operand
	op = &m680x->operands[m680x->op_count++];
	op->type = M680X_OP_CONSTANT;
	op->const_val = (post_byte >> 3) & 0x07;

	// operand[2] = bit index in destination operand
	op = &m680x->operands[m680x->op_count++];
	op->type = M680X_OP_CONSTANT;
	op->const_val = post_byte & 0x07;

	direct_hdlr(MI, info, address);
}